

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstack.cc
# Opt level: O3

int main(int argc,char **argv)

{
  _Any_data *p_Var1;
  pointer pbVar2;
  int iVar3;
  uint uVar4;
  __pid_t _Var5;
  __pid_t _Var6;
  undefined8 uVar7;
  Flags *pFVar8;
  void *pvVar9;
  long lVar10;
  ostream *poVar11;
  int *piVar12;
  char *pcVar13;
  size_t sVar14;
  FILE *__stream;
  uint uVar15;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var16;
  ulonglong uVar17;
  ulong uVar18;
  size_type __n;
  pointer __pos;
  ulonglong uVar19;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  ulonglong uVar20;
  ulong uVar21;
  undefined1 auVar22 [8];
  double dVar23;
  undefined1 local_26e8 [8];
  char line [4096];
  char statusBuf [4096];
  long local_6e0;
  ofstream out;
  ios_base local_5e8 [264];
  sigaction local_4e0;
  undefined1 auStack_448 [8];
  Flags flags;
  Context context;
  ostream *local_360;
  undefined1 local_350;
  char local_34f [2];
  undefined1 local_34d;
  undefined1 local_34c;
  undefined1 local_34b [3];
  undefined1 local_348 [4];
  undefined1 local_344 [12];
  int local_338;
  Context *local_318;
  undefined8 local_310;
  code *local_308;
  code *local_300;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **local_2f8;
  undefined8 local_2f0;
  code *local_2e8;
  code *local_2e0;
  Context *local_2d8;
  int *local_2d0;
  code *local_2c8;
  code *local_2c0;
  Context *local_2b8;
  int *local_2b0;
  code *local_2a8;
  code *local_2a0;
  undefined1 *local_298;
  undefined8 local_290;
  code *local_288;
  code *local_280;
  undefined1 *local_278;
  undefined8 local_270;
  code *local_268;
  code *local_260;
  undefined8 *local_258;
  undefined8 local_250;
  code *local_248;
  code *local_240;
  double *local_238;
  undefined8 local_230;
  code *local_228;
  code *local_220;
  _Any_data local_218;
  code *local_208;
  code *local_200;
  _Any_data local_1f8;
  code *local_1e8;
  code *local_1e0;
  int *local_1d8;
  long *local_1d0;
  code *local_1c8;
  code *local_1c0;
  _Any_data local_1b8;
  code *local_1a8;
  code *local_1a0;
  _Any_data local_198;
  code *local_188;
  code *local_180;
  long *local_178;
  undefined8 uStack_170;
  code *local_168;
  code *pcStack_160;
  undefined1 local_150 [8];
  string execName;
  int status;
  undefined1 local_110 [8];
  pid_t pid;
  _Manager_type local_100;
  code *local_f8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_f0;
  double sleepTime;
  string subprocessCmd;
  undefined1 auStack_a8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  undefined1 local_88 [16];
  _Manager_type local_78;
  code *local_70;
  int local_60;
  uint local_5c;
  int exitCode;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  undefined1 local_39;
  uint local_38;
  bool printAllStacks;
  
  piVar12 = &flags.longVal;
  pstack::Context::Context((Context *)piVar12);
  memset(&local_4e0.sa_mask,0,0x90);
  local_4e0.__sigaction_handler.sa_handler = main::anon_class_1_0_00000001::__invoke;
  local_4e0.sa_flags = -0x80000000;
  sigaction(2,&local_4e0,(sigaction *)0x0);
  local_f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  _exitCode = argv;
  std::ofstream::ofstream(&local_6e0);
  local_150 = (undefined1  [8])&execName._M_string_length;
  execName._M_dataplus._M_p = (pointer)0x0;
  execName._M_string_length._0_1_ = 0;
  local_39 = 0;
  local_60 = -1;
  sleepTime = (double)&subprocessCmd._M_string_length;
  subprocessCmd._M_dataplus._M_p = (pointer)0x0;
  subprocessCmd._M_string_length._0_1_ = 0;
  flags.data._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&flags.data;
  flags.longOptions.super__Vector_base<option,_std::allocator<option>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_448 = (undefined1  [8])0x0;
  flags.longOptions.super__Vector_base<option,_std::allocator<option>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  flags.data._M_t._M_impl._0_4_ = 0;
  flags.data._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  flags.data._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  flags.data._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  flags.data._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)&flags.shortOptions._M_string_length;
  flags.shortOptions._M_dataplus._M_p = (pointer)0x0;
  flags.shortOptions._M_string_length._0_1_ = 0;
  flags.shortOptions.field_2._8_4_ = 0xfffffffe;
  local_168 = (code *)0x0;
  pcStack_160 = (code *)0x0;
  local_178 = (long *)0x0;
  uStack_170 = 0;
  flags.data._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       flags.data._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  local_178 = (long *)operator_new(0x18);
  *local_178 = (long)&exitCode;
  local_178[1] = (long)auStack_448;
  local_178[2] = (long)piVar12;
  pcStack_160 = std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/pstack.cc:231:13)>
                ::_M_invoke;
  local_168 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/pstack.cc:231:13)>
              ::_M_manager;
  uVar7 = pstack::Flags::add(auStack_448,"replace-path",0x46,"from:to",
                             "replace `from` with `to` in paths when finding shared libraries");
  local_310 = 0;
  local_300 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/pstack.cc:242:13)>
              ::_M_invoke;
  local_308 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/pstack.cc:242:13)>
              ::_M_manager;
  local_318 = (Context *)piVar12;
  uVar7 = pstack::Flags::add(uVar7,"debug-dir",0x67,"directory",
                             "extra location to find debug files for binaries and shared libraries")
  ;
  local_2f0 = 0;
  local_2f8 = &local_f0;
  local_2e0 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/libpstack/flags.h:95:26)>
              ::_M_invoke;
  local_2e8 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/libpstack/flags.h:95:26)>
              ::_M_manager;
  uVar7 = pstack::Flags::add(uVar7,"constant",0x62,"delay",
                             "repeat pstack, with `delay` seconds between each iteration (can be non-integer)"
                            );
  local_2c0 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/pstack.cc:254:13)>
              ::_M_invoke;
  local_2c8 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/pstack.cc:254:13)>
              ::_M_manager;
  local_2d8 = (Context *)piVar12;
  local_2d0 = &local_60;
  uVar7 = pstack::Flags::add(uVar7,"elf-dump",100,"ELF file",
                             "dump details of an ELF image in JSON and exit");
  local_2a0 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/pstack.cc:262:13)>
              ::_M_invoke;
  local_2a8 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/pstack.cc:262:13)>
              ::_M_manager;
  local_2b8 = (Context *)piVar12;
  local_2b0 = &local_60;
  local_5c = argc;
  uVar7 = pstack::Flags::add(uVar7,"dwarf-dump",0x44,"ELF file",
                             "dump details of DWARF information in an ELF image in JSON and exit");
  local_298 = local_348;
  local_290 = 0;
  local_280 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/libpstack/flags.h:95:26)>
              ::_M_invoke;
  local_288 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/libpstack/flags.h:95:26)>
              ::_M_manager;
  uVar7 = pstack::Flags::add(uVar7,"depth",0x72,"depth","max depth when printing python structures")
  ;
  local_278 = local_344;
  local_270 = 0;
  local_260 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/libpstack/flags.h:95:26)>
              ::_M_invoke;
  local_268 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/libpstack/flags.h:95:26)>
              ::_M_manager;
  pFVar8 = (Flags *)pstack::Flags::add(uVar7,"max-frames",0x4d,"max frames",
                                       "maximum number of stack frames to print for a thread");
  statusBuf[0] = '\0';
  statusBuf[1] = '\0';
  statusBuf[2] = '\0';
  statusBuf[3] = '\0';
  statusBuf[4] = '\0';
  statusBuf[5] = '\0';
  statusBuf[6] = '\0';
  statusBuf[7] = '\0';
  line._4088_8_ = operator_new(0x18);
  *(int **)line._4088_8_ = &local_60;
  *(int **)(line._4088_8_ + 8) = &exitCode;
  *(undefined1 **)(line._4088_8_ + 0x10) = auStack_448;
  statusBuf._16_8_ =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/pstack.cc:283:13)>
       ::_M_invoke;
  statusBuf._8_8_ =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/pstack.cc:283:13)>
       ::_M_manager;
  pFVar8 = pstack::Flags::add(pFVar8,"help",0x68,"generate this help message",(VCb *)(line + 0xff8))
  ;
  local_26e8 = (undefined1  [8])local_34f;
  line[0] = '\x01';
  line[1] = '\0';
  line[2] = '\0';
  line[3] = '\0';
  line[4] = '\0';
  line[5] = '\0';
  line[6] = '\0';
  line[7] = '\0';
  line._16_8_ = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/libpstack/flags.h:90:38)>
                ::_M_invoke;
  line._8_8_ = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/libpstack/flags.h:90:38)>
               ::_M_manager;
  pFVar8 = pstack::Flags::add(pFVar8,"args",0x61,
                              "attempt to show the value of arguments to functions",
                              (VCb *)local_26e8);
  args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x1;
  auStack_a8 = (undefined1  [8])&(anonymous_namespace)::doJson;
  args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/libpstack/flags.h:90:38)>
                ::_M_invoke;
  args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/libpstack/flags.h:90:38)>
                ::_M_manager;
  pFVar8 = pstack::Flags::add(pFVar8,"json",0x6a,"use JSON output rather than plaintext",
                              (VCb *)auStack_a8);
  local_88._0_8_ = &local_350;
  local_88._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
  local_70 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/libpstack/flags.h:90:38)>
             ::_M_invoke;
  local_78 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/libpstack/flags.h:90:38)>
             ::_M_manager;
  pFVar8 = pstack::Flags::add(pFVar8,"no-src",0x73,"don\'t include source info",(VCb *)local_88);
  subprocessCmd.field_2._8_8_ = &flags.longVal;
  pFVar8 = pstack::Flags::add(pFVar8,"verbose",0x76,"more debugging data. Can be repeated",
                              (VCb *)((long)&subprocessCmd.field_2 + 8));
  execName.field_2._8_8_ = &local_34d;
  pFVar8 = pstack::Flags::add(pFVar8,"no-threaddb",0x74,
                              "don\'t use the thread_db functions to enumerate pthreads (just uses LWPs)"
                              ,(VCb *)((long)&execName.field_2 + 8));
  _pid = 1;
  local_110 = (undefined1  [8])&local_39;
  local_f8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/libpstack/flags.h:90:38)>
             ::_M_invoke;
  local_100 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/libpstack/flags.h:90:38)>
              ::_M_manager;
  pFVar8 = pstack::Flags::add(pFVar8,"all",0x41,
                              "show both python and DWARF (C/C++/go/rust) stack traces",
                              (VCb *)local_110);
  local_1b8._M_unused._M_object = local_34b;
  local_1b8._8_8_ = 1;
  local_1a0 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/libpstack/flags.h:90:38)>
              ::_M_invoke;
  local_1a8 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/libpstack/flags.h:90:38)>
              ::_M_manager;
  pFVar8 = pstack::Flags::add(pFVar8,"no-ext-debug",0x6e,
                              "don\'t load external debugging information when processing",
                              (VCb *)&local_1b8);
  local_198._8_8_ = 0;
  local_180 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/pstack.cc:323:13)>
              ::_M_invoke;
  local_188 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/pstack.cc:323:13)>
              ::_M_manager;
  local_198._M_unused._M_object = &local_60;
  pFVar8 = pstack::Flags::add(pFVar8,"version",0x56,"dump version and exit",(VCb *)&local_198);
  local_250 = 0;
  local_258 = (undefined8 *)local_150;
  local_240 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/pstack.cc:346:43)>
              ::_M_invoke;
  local_248 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/pstack.cc:346:43)>
              ::_M_manager;
  uVar7 = pstack::Flags::add(pFVar8,"executable",0x65,"executable","executable to use by default");
  local_230 = 0;
  local_238 = &sleepTime;
  local_220 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/libpstack/flags.h:95:26)>
              ::_M_invoke;
  local_228 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/libpstack/flags.h:95:26)>
              ::_M_manager;
  pFVar8 = (Flags *)pstack::Flags::add(uVar7,"command",0x78,"command line",
                                       "execute command line as subprocess, trace when it receives a signal"
                                      );
  local_218._M_unused._M_object = &local_34c;
  local_218._8_8_ = 1;
  local_200 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/libpstack/flags.h:90:38)>
              ::_M_invoke;
  local_208 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/libpstack/flags.h:90:38)>
              ::_M_manager;
  pFVar8 = pstack::Flags::add(pFVar8,"no-die-names",0x59,"do not use DIE names for functions",
                              (VCb *)&local_218);
  local_1f8._8_8_ = 1;
  local_1f8._M_unused._M_object = &(anonymous_namespace)::freeres;
  local_1e0 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/libpstack/flags.h:90:38)>
              ::_M_invoke;
  local_1e8 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/libpstack/flags.h:90:38)>
              ::_M_manager;
  pFVar8 = pstack::Flags::add(pFVar8,"freeres",0,
                              "free all memory at exit (useful for valgrind/heapcheck)",
                              (VCb *)&local_1f8);
  local_1d8 = &flags.longVal;
  local_1d0 = &local_6e0;
  local_1c0 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/pstack.cc:359:62)>
              ::_M_invoke;
  local_1c8 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/pstack.cc:359:62)>
              ::_M_manager;
  iVar3 = pstack::Flags::add(pFVar8,"output",0x6f,"output file",
                             "write output to <output file> instead of stdout");
  uVar4 = local_5c;
  pstack::Flags::parse(iVar3,(char **)(ulong)local_5c);
  if (local_1c8 != (code *)0x0) {
    (*local_1c8)(&local_1d8,&local_1d8,3);
  }
  if (local_1e8 != (code *)0x0) {
    (*local_1e8)(&local_1f8,&local_1f8,__destroy_functor);
  }
  if (local_208 != (code *)0x0) {
    (*local_208)(&local_218,&local_218,__destroy_functor);
  }
  if (local_228 != (code *)0x0) {
    (*local_228)(&local_238,&local_238,3);
  }
  if (local_248 != (code *)0x0) {
    (*local_248)(&local_258,&local_258,3);
  }
  if (local_188 != (code *)0x0) {
    (*local_188)(&local_198,&local_198,__destroy_functor);
  }
  if (local_1a8 != (code *)0x0) {
    (*local_1a8)(&local_1b8,&local_1b8,__destroy_functor);
  }
  if (local_100 != (_Manager_type)0x0) {
    (*local_100)((_Any_data *)local_110,(_Any_data *)local_110,__destroy_functor);
  }
  p_Var1 = (_Any_data *)((long)&execName.field_2 + 8);
  std::
  _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/libpstack/flags.h:90:38)>
  ::_M_manager(p_Var1,p_Var1,__destroy_functor);
  p_Var1 = (_Any_data *)((long)&subprocessCmd.field_2 + 8);
  std::
  _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/pstack.cc:303:13)>
  ::_M_manager(p_Var1,p_Var1,__destroy_functor);
  if (local_78 != (_Manager_type)0x0) {
    (*local_78)((_Any_data *)local_88,(_Any_data *)local_88,__destroy_functor);
  }
  if (args.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
    (*(code *)args.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish)(auStack_a8,auStack_a8,3);
  }
  if (line._8_8_ != 0) {
    (*(code *)line._8_8_)(local_26e8,local_26e8,3);
  }
  if (statusBuf._8_8_ != 0) {
    (*(code *)statusBuf._8_8_)(line + 0xff8,line + 0xff8,3);
  }
  if (local_268 != (code *)0x0) {
    (*local_268)(&local_278,&local_278,3);
  }
  if (local_288 != (code *)0x0) {
    (*local_288)(&local_298,&local_298,3);
  }
  if (local_2a8 != (code *)0x0) {
    (*local_2a8)(&local_2b8,&local_2b8,3);
  }
  if (local_2c8 != (code *)0x0) {
    (*local_2c8)(&local_2d8,&local_2d8,3);
  }
  if (local_2e8 != (code *)0x0) {
    (*local_2e8)(&local_2f8,&local_2f8,3);
  }
  if (local_308 != (code *)0x0) {
    (*local_308)(&local_318,&local_318,3);
  }
  if (local_168 != (code *)0x0) {
    (*local_168)(&local_178,&local_178,3);
  }
  iVar3 = local_60;
  if (local_60 == -1) {
    iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_150,"");
    if (iVar3 == 0) {
      p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      uVar7 = (undefined1 *)0x0;
    }
    else {
      pstack::Context::getImageForName((string *)(line + 0xff8),(bool)((char)&flags + 'h'));
      p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)statusBuf._0_8_;
      uVar7 = line._4088_8_;
    }
    iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &sleepTime,"");
    local_48 = p_Var16;
    if (iVar3 == 0) {
      lVar10 = (long)(int)_optind;
      if (_optind == uVar4) {
        iVar3 = 0x40;
        anon_unknown.dwarf_15577::usage((ostream *)&std::cerr,*_exitCode,(Flags *)auStack_448);
      }
      else {
        iVar3 = 0;
        if ((int)_optind < (int)uVar4) {
          local_50 = local_f0;
          dVar23 = (double)local_f0 * 1000000.0;
          local_38 = 0;
          do {
            local_88._8_8_ = local_48;
            if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                local_48->_M_use_count = local_48->_M_use_count + 1;
                UNLOCK();
              }
              else {
                local_48->_M_use_count = local_48->_M_use_count + 1;
              }
            }
            local_88._0_8_ = uVar7;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)(line + 0xff8),_exitCode[lVar10],(allocator<char> *)local_26e8);
            pstack::Procman::Process::load
                      (auStack_a8,&flags.longVal,local_88,(string *)(line + 0xff8));
            if ((char *)line._4088_8_ != statusBuf + 8) {
              operator_delete((void *)line._4088_8_,statusBuf._8_8_ + 1);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_);
            }
            auVar22 = auStack_a8;
            if (auStack_a8 == (undefined1  [8])0x0) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_26e8,_exitCode[lVar10],
                         (allocator<char> *)(execName.field_2._M_local_buf + 8));
              pstack::Context::getImageForName
                        ((string *)(subprocessCmd.field_2._M_local_buf + 8),
                         (bool)((char)&flags + 'h'));
              uVar7 = subprocessCmd.field_2._8_8_;
              subprocessCmd.field_2._8_8_ = 0;
              if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
              }
              p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              if (local_26e8 != (undefined1  [8])(line + 8)) {
                operator_delete((void *)local_26e8,line._8_8_ + 1);
              }
            }
            else {
              while (p_Var16 = local_48, (anonymous_namespace)::interrupted == '\0') {
                anon_unknown.dwarf_15577::pstack((Process *)auVar22);
                if (((double)local_50 == 0.0) && (p_Var16 = local_48, !NAN((double)local_50)))
                break;
                usleep((__useconds_t)(long)dVar23);
              }
            }
            if (args.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         args.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start);
            }
            lVar10 = lVar10 + 1;
            local_48 = p_Var16;
          } while ((uint)lVar10 != local_5c);
          iVar3 = 0x46;
          if ((local_38 & 1) == 0) {
            iVar3 = 0;
          }
        }
      }
    }
    else {
      if (p_Var16 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var16->_M_use_count = p_Var16->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var16->_M_use_count = p_Var16->_M_use_count + 1;
        }
      }
      auStack_a8 = (undefined1  [8])0x0;
      args.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      args.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      subprocessCmd.field_2._8_8_ = uVar7;
      if (subprocessCmd._M_dataplus._M_p == (pointer)0x0) {
        __pos = (pointer)0x0;
      }
      else {
        __pos = (pointer)0x0;
        do {
          dVar23 = sleepTime;
          pvVar9 = memchr(__pos + (long)sleepTime,0x20,
                          (long)subprocessCmd._M_dataplus._M_p - (long)__pos);
          if ((pvVar9 == (void *)0x0) ||
             (__n = (long)pvVar9 - (long)dVar23, __n == 0xffffffffffffffff)) break;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (line + 0xff8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sleepTime
                     ,(size_type)__pos,__n);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)auStack_a8
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (line + 0xff8));
          if ((char *)line._4088_8_ != statusBuf + 8) {
            operator_delete((void *)line._4088_8_,statusBuf._8_8_ + 1);
          }
          __pos = (pointer)(__n + 1);
        } while (__pos < subprocessCmd._M_dataplus._M_p);
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(line + 0xff8)
                 ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sleepTime,
                 (size_type)__pos,0xffffffffffffffff);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)auStack_a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(line + 0xff8)
                );
      if ((char *)line._4088_8_ != statusBuf + 8) {
        operator_delete((void *)line._4088_8_,statusBuf._8_8_ + 1);
      }
      uVar4 = fork();
      local_110._0_4_ = uVar4;
      if (uVar4 != 0xffffffff) {
        if (uVar4 == 0) {
          lVar10 = ptrace(PTRACE_TRACEME,0,0,0);
          pbVar2 = args.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if ((int)lVar10 != 0) {
            __assert_fail("rc == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/pstack.cc"
                          ,0x4b,
                          "int (anonymous namespace)::startChild(Context &, Elf::Object::sptr, const std::string &)"
                         );
          }
          line[0xff8] = '\0';
          line[0xff9] = '\0';
          line[0xffa] = '\0';
          line[0xffb] = '\0';
          line[0xffc] = '\0';
          line[0xffd] = '\0';
          line[0xffe] = '\0';
          line[0xfff] = '\0';
          statusBuf[0] = '\0';
          statusBuf[1] = '\0';
          statusBuf[2] = '\0';
          statusBuf[3] = '\0';
          statusBuf[4] = '\0';
          statusBuf[5] = '\0';
          statusBuf[6] = '\0';
          statusBuf[7] = '\0';
          statusBuf[8] = '\0';
          statusBuf[9] = '\0';
          statusBuf[10] = '\0';
          statusBuf[0xb] = '\0';
          statusBuf[0xc] = '\0';
          statusBuf[0xd] = '\0';
          statusBuf[0xe] = '\0';
          statusBuf[0xf] = '\0';
          if (auStack_a8 !=
              (undefined1  [8])
              args.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            auVar22 = auStack_a8;
            do {
              local_26e8 = (undefined1  [8])(((pointer)auVar22)->_M_dataplus)._M_p;
              std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
                        ((vector<char_const*,std::allocator<char_const*>> *)(line + 0xff8),
                         (char **)local_26e8);
              auVar22 = (undefined1  [8])((long)auVar22 + 0x20);
            } while (auVar22 != (undefined1  [8])pbVar2);
          }
          local_26e8 = (undefined1  [8])0x0;
          std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
                    ((vector<char_const*,std::allocator<char_const*>> *)(line + 0xff8),
                     (char **)local_26e8);
          execvp(*(char **)line._4088_8_,(char **)line._4088_8_);
          if (2 < local_338) {
            _Var5 = getpid();
            poVar11 = (ostream *)std::ostream::operator<<(local_360,_Var5);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11," execvp failed: ",0x10);
            piVar12 = __errno_location();
            pcVar13 = strerror(*piVar12);
            if (pcVar13 == (char *)0x0) {
              std::ios::clear((int)poVar11 + (int)*(undefined8 *)(*(long *)poVar11 + -0x18));
            }
            else {
              sVar14 = strlen(pcVar13);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar13,sVar14);
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
          }
          if (line._4088_8_ != 0) {
            operator_delete((void *)line._4088_8_,statusBuf._8_8_ - line._4088_8_);
          }
        }
        else {
          snprintf(line + 0xff8,0x1000,"/proc/%d/status",(ulong)uVar4);
          __stream = fopen64(line + 0xff8,"r");
          if (__stream == (FILE *)0x0) {
            __assert_fail("statusFile.get()",
                          "/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/pstack.cc"
                          ,0x5f,
                          "int (anonymous namespace)::startChild(Context &, Elf::Object::sptr, const std::string &)"
                         );
          }
          this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          while( true ) {
            local_50 = this;
            if (2 < local_338) {
              _Var5 = getpid();
              poVar11 = (ostream *)std::ostream::operator<<(local_360,_Var5);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11," waiting...\n",0xc);
            }
            _Var5 = wait((void *)((long)&execName.field_2 + 8));
            if (_Var5 != local_110._0_4_) break;
            if (2 < local_338) {
              _Var6 = getpid();
              poVar11 = (ostream *)std::ostream::operator<<(local_360,_Var6);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11,"... done - rc=",0xe);
              poVar11 = (ostream *)std::ostream::operator<<((ostream *)poVar11,_Var5);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11,", status=",9);
              poVar11 = (ostream *)
                        pstack::Procman::operator<<(poVar11,(WaitStatus)execName.field_2._8_4_);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
            }
            if (execName.field_2._M_local_buf[8] != '\x7f') goto LAB_00107982;
            fflush(__stream);
            fseek(__stream,0,0);
            pcVar13 = fgets(local_26e8,0x1000,__stream);
            if (pcVar13 == (char *)0x0) {
              uVar18 = 0xffffffffffffffff;
            }
            else {
              uVar20 = 0xffffffffffffffff;
              uVar19 = 0xffffffffffffffff;
              uVar17 = 0xffffffffffffffff;
              do {
                if (local_26e8 == (undefined1  [8])0x93a746743676953) {
                  uVar20 = strtoull(line,(char **)0x0,0x10);
                }
                else if (local_26e8 == (undefined1  [8])0x93a6e6749676953) {
                  uVar19 = strtoull(line,(char **)0x0,0x10);
                }
                else if (local_26e8 == (undefined1  [8])0x93a6b6c42676953) {
                  uVar17 = strtoull(line,(char **)0x0,0x10);
                }
                pcVar13 = fgets(local_26e8,0x1000,__stream);
              } while (pcVar13 != (char *)0x0);
              uVar18 = uVar17 | uVar19 | uVar20 | 0x10;
            }
            uVar15 = (uint)execName.field_2._8_4_ >> 8 & 0xff;
            uVar4 = uVar15;
            if (uVar15 == 5) {
              uVar4 = 0;
            }
            uVar21 = (ulong)uVar4;
            if (uVar15 == 0x13) {
              uVar21 = 0;
            }
            if ((uVar18 & (long)(1 << ((char)((ulong)execName.field_2._8_8_ >> 8) - 1U & 0x1f))) ==
                0) {
              local_198._M_pod_data[0] = 1;
              local_88._0_8_ = (Process *)0x0;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
              __shared_count<pstack::Procman::LiveProcess,std::allocator<pstack::Procman::LiveProcess>,pstack::Context&,std::shared_ptr<pstack::Elf::Object>&,int&,bool>
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88 + 8),
                         (LiveProcess **)local_88,
                         (allocator<pstack::Procman::LiveProcess> *)&local_1b8,
                         (Context *)&flags.longVal,
                         (shared_ptr<pstack::Elf::Object> *)((long)&subprocessCmd.field_2 + 8),
                         (int *)local_110,(bool *)local_198._M_pod_data);
              this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_;
              uVar7 = local_88._0_8_;
              local_88._0_8_ = (undefined1 *)0x0;
              local_88._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              if ((local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                 (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50),
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_ !=
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_);
              }
              pstack::Procman::Process::load();
              anon_unknown.dwarf_15577::pstack((Process *)uVar7);
              lVar10 = ptrace(PTRACE_KILL,(ulong)local_110 & 0xffffffff,0,uVar21);
              iVar3 = (int)lVar10;
            }
            else {
              lVar10 = ptrace(PTRACE_CONT,(ulong)local_110 & 0xffffffff,0,uVar21);
              iVar3 = (int)lVar10;
              this = local_50;
            }
            if (iVar3 != 0) {
              if (iVar3 == -1) {
                _Var5 = getpid();
                poVar11 = (ostream *)std::ostream::operator<<(local_360,_Var5);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar11," ptrace failed to kill/continue - ",0x22);
                piVar12 = __errno_location();
                pcVar13 = strerror(*piVar12);
                if (pcVar13 == (char *)0x0) {
                  std::ios::clear((int)poVar11 + (int)*(undefined8 *)(*(long *)poVar11 + -0x18));
                }
                else {
                  sVar14 = strlen(pcVar13);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar13,sVar14);
                }
                std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
              }
              __assert_fail("rc == 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/pstack.cc"
                            ,0x8a,
                            "int (anonymous namespace)::startChild(Context &, Elf::Object::sptr, const std::string &)"
                           );
            }
            if (2 < local_338) {
              _Var5 = getpid();
              poVar11 = (ostream *)std::ostream::operator<<(local_360,_Var5);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11,"..done\n",7);
            }
          }
          if (2 < local_338) {
            _Var5 = getpid();
            poVar11 = (ostream *)std::ostream::operator<<(local_360,_Var5);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,"... wait failed: ",0x11);
            piVar12 = __errno_location();
            pcVar13 = strerror(*piVar12);
            if (pcVar13 == (char *)0x0) {
              std::ios::clear((int)poVar11 + (int)*(undefined8 *)(*(long *)poVar11 + -0x18));
            }
            else {
              sVar14 = strlen(pcVar13);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar13,sVar14);
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
          }
LAB_00107982:
          fclose(__stream);
          if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
          }
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)auStack_a8);
      iVar3 = 0;
      if (p_Var16 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var16);
      }
    }
    if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
    }
  }
  if ((size_type *)flags.data._M_t._M_impl.super__Rb_tree_header._M_node_count !=
      &flags.shortOptions._M_string_length) {
    operator_delete((void *)flags.data._M_t._M_impl.super__Rb_tree_header._M_node_count,
                    CONCAT71(flags.shortOptions._M_string_length._1_7_,
                             (undefined1)flags.shortOptions._M_string_length) + 1);
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_pstack::Flags::Data>,_std::_Select1st<std::pair<const_int,_pstack::Flags::Data>_>,_std::less<int>,_std::allocator<std::pair<const_int,_pstack::Flags::Data>_>_>
  ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_pstack::Flags::Data>,_std::_Select1st<std::pair<const_int,_pstack::Flags::Data>_>,_std::less<int>,_std::allocator<std::pair<const_int,_pstack::Flags::Data>_>_>
               *)&flags.longOptions.super__Vector_base<option,_std::allocator<option>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
  if (auStack_448 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_448,
                    (long)flags.longOptions.super__Vector_base<option,_std::allocator<option>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)auStack_448);
  }
  if ((size_type *)sleepTime != &subprocessCmd._M_string_length) {
    operator_delete((void *)sleepTime,
                    CONCAT71(subprocessCmd._M_string_length._1_7_,
                             (undefined1)subprocessCmd._M_string_length) + 1);
  }
  if (local_150 != (undefined1  [8])&execName._M_string_length) {
    operator_delete((void *)local_150,
                    CONCAT71(execName._M_string_length._1_7_,(undefined1)execName._M_string_length)
                    + 1);
  }
  local_6e0 = _VTT;
  *(undefined8 *)((long)&local_6e0 + *(long *)(_VTT + -0x18)) = ___throw_bad_array_new_length;
  std::filebuf::~filebuf((filebuf *)&out);
  std::ios_base::~ios_base(local_5e8);
  if ((anonymous_namespace)::freeres != '\0') {
    pstack::Context::~Context((Context *)&flags.longVal);
    return iVar3;
  }
  exit(iVar3);
}

Assistant:

int
main(int argc, char **argv)
{
    try {
        Context context;
        struct sigaction sa;
        memset(&sa, 0, sizeof sa);
        sa.sa_handler = [](int) { interrupted = true; };
        // Only interrupt cleanly once. Then just terminate, in case we're stuck in a loop
        sa.sa_flags = SA_RESETHAND;
        sigaction(SIGINT, &sa, nullptr);
        int rc = emain(argc, argv, context);

        // Normally, exit without free'ing imagecache - don't waste effort
        // moving pointers around in a terminating process
        if (!freeres)
           exit(rc);
        return rc;
    }
    catch (std::exception &ex) {
        std::clog << "error: " << ex.what() << std::endl;
        return EX_SOFTWARE;
    }
}